

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O0

void uss_stat(SftpServer *srv,SftpReplyBuilder *reply,ptrlen path,_Bool follow_symlinks)

{
  int iVar1;
  char *__ptr;
  code *pcVar2;
  int status;
  char *pathstr;
  stat st;
  UnixSftpServer *uss;
  _Bool follow_symlinks_local;
  SftpReplyBuilder *reply_local;
  SftpServer *srv_local;
  ptrlen path_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)(srv + -6);
  __ptr = mkstr(path);
  pcVar2 = lstat;
  if (follow_symlinks) {
    pcVar2 = stat;
  }
  iVar1 = (*pcVar2)(__ptr,&pathstr);
  free(__ptr);
  if (iVar1 < 0) {
    uss_error((UnixSftpServer *)st.__glibc_reserved[2],reply);
  }
  else {
    uss_reply_struct_stat(reply,(stat *)&pathstr);
  }
  return;
}

Assistant:

static void uss_stat(SftpServer *srv, SftpReplyBuilder *reply,
                     ptrlen path, bool follow_symlinks)
{
    UnixSftpServer *uss = container_of(srv, UnixSftpServer, srv);
    struct stat st;

    char *pathstr = mkstr(path);
    int status = (follow_symlinks ? stat : lstat) (pathstr, &st);
    free(pathstr);

    if (status < 0) {
        uss_error(uss, reply);
    } else {
        uss_reply_struct_stat(reply, &st);
    }
}